

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_shared_mutex.hpp
# Opt level: O0

bool __thiscall
yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::
do_try_lockwait<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *this,
          time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *tp,char *emsg)

{
  bool bVar1;
  cv_status cVar2;
  system_error *this_00;
  error_code eVar3;
  error_code __ec;
  undefined1 local_40 [8];
  unique_lock<std::mutex> lk;
  id tid;
  char *emsg_local;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *tp_local;
  mutex *this_local;
  
  lk._8_8_ = std::this_thread::get_id();
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_40,(mutex_type *)(this + 0x58));
  bVar1 = std::operator==((id)*(native_handle_type *)(this + 8),(id)lk._8_8_);
  if ((bVar1) ||
     (bVar1 = detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::is_shared_owner
                        ((shared_mutex_base<yamc::rwlock::ReaderPrefer> *)this,(id)lk._8_8_), bVar1)
     ) {
    this_00 = (system_error *)__cxa_allocate_exception(0x20);
    eVar3 = std::make_error_code(resource_deadlock_would_occur);
    __ec._M_cat = eVar3._M_cat;
    __ec._4_4_ = 0;
    __ec._M_value = eVar3._M_value;
    std::system_error::system_error(this_00,__ec,emsg);
    __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  rwlock::ReaderPrefer::before_wait_wlock((state *)this);
  do {
    bVar1 = rwlock::ReaderPrefer::wait_wlock((state *)this);
    if (!bVar1) goto LAB_0022decb;
    cVar2 = std::condition_variable::
            wait_until<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                      ((condition_variable *)(this + 0x28),(unique_lock<std::mutex> *)local_40,tp);
  } while (cVar2 != timeout);
  bVar1 = rwlock::ReaderPrefer::wait_wlock((state *)this);
  if (bVar1) {
    rwlock::ReaderPrefer::after_wait_wlock((state *)this);
    this_local._7_1_ = false;
  }
  else {
LAB_0022decb:
    rwlock::ReaderPrefer::after_wait_wlock((state *)this);
    rwlock::ReaderPrefer::acquire_wlock((state *)this);
    *(undefined8 *)(this + 8) = lk._8_8_;
    validator::deadlock::locked((uintptr_t)this,(id)lk._8_8_,false);
    this_local._7_1_ = true;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
  return this_local._7_1_;
}

Assistant:

bool do_try_lockwait(const std::chrono::time_point<Clock, Duration>& tp, const char* emsg)
  {
    const auto tid = std::this_thread::get_id();
    std::unique_lock<decltype(mtx_)> lk(mtx_);
    if (e_owner_ == tid || base::is_shared_owner(tid)) {
      // non-recursive semantics
#if YAMC_CHECKED_CALL_ABORT
      std::abort();
      (void)emsg; // suppress "unused variable" warning
#else
      throw std::system_error(std::make_error_code(std::errc::resource_deadlock_would_occur), emsg);
#endif
    }
    RwLockPolicy::before_wait_wlock(state_);
    while (RwLockPolicy::wait_wlock(state_)) {
      if (cv_.wait_until(lk, tp) == std::cv_status::timeout) {
        if (!RwLockPolicy::wait_wlock(state_))  // re-check predicate
          break;
        RwLockPolicy::after_wait_wlock(state_);
        return false;
      }
    }
    RwLockPolicy::after_wait_wlock(state_);
    RwLockPolicy::acquire_wlock(state_);
    e_owner_ = tid;
    detail::validator::locked(reinterpret_cast<uintptr_t>(this), tid, false);
    return true;
  }